

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void * c4::arealloc(void *ptr,size_t oldsz,size_t newsz,size_t alignment)

{
  void *pvVar1;
  
  if (detail::s_arealloc == (undefined *)0x0) {
    arealloc();
  }
  pvVar1 = (void *)(*(code *)detail::s_arealloc)(ptr,oldsz,newsz,alignment);
  return pvVar1;
}

Assistant:

void* arealloc(void *ptr, size_t oldsz, size_t newsz, size_t alignment)
{
    C4_ASSERT_MSG(c4::get_arealloc() != nullptr, "did you forget to call set_arealloc()?");
    auto fn = c4::get_arealloc();
    void* nptr = fn(ptr, oldsz, newsz, alignment);
    return nptr;
}